

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prs.c
# Opt level: O0

void prsgini(prscxdef *ctx,prsndef *node,uint curfr)

{
  ushort uVar1;
  long lVar2;
  uint uVar3;
  uint in_EDX;
  prscxdef *in_RSI;
  long in_RDI;
  uint oldofs;
  uchar *p;
  int lcl;
  uint in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  ushort objn;
  tokcxdef *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  
  objn = (ushort)((uint)in_stack_ffffffffffffffdc >> 0x10);
  if (in_RSI->prscxgtab != (toktdef *)0x0) {
    prsgini(in_RSI,(prsndef *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
            (uint)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  }
  if (*(int *)((long)&in_RSI->prscxerr + 4) == 4) {
    dbgclin(in_stack_ffffffffffffffe0,objn,in_stack_ffffffffffffffd8);
    uVar3 = (uint)*(ushort *)(*(long *)(in_RDI + 0x28) + 0x12);
    in_stack_ffffffffffffffe0 =
         (tokcxdef *)(in_RDI + 0xd0 + (long)(int)(uint)*(ushort *)&in_RSI->prscxmem->mcmcxldc);
    emtres((emtcxdef *)in_stack_ffffffffffffffe0,0);
    memcpy((void *)(*(long *)(*(long *)(in_RDI + 0x28) + 0x18) +
                   (long)(int)(uint)*(ushort *)(*(long *)(in_RDI + 0x28) + 0x12)),
           in_stack_ffffffffffffffe0,
           (ulong)(*(byte *)((long)&in_stack_ffffffffffffffe0->tokcxerr + 1) + 1));
    *(ushort *)(*(long *)(in_RDI + 0x28) + 0x12) =
         *(short *)(*(long *)(in_RDI + 0x28) + 0x12) +
         *(byte *)((long)&in_stack_ffffffffffffffe0->tokcxerr + 1) + 1;
    oswp2((void *)(*(long *)(*(long *)(in_RDI + 0x28) + 0x18) + (ulong)(uVar3 + 2)),in_EDX);
    objn = (ushort)(uVar3 >> 0x10);
  }
  prsgexp(ctx,node);
  emtres((emtcxdef *)in_stack_ffffffffffffffe0,objn);
  lVar2 = *(long *)(*(long *)(in_RDI + 0x28) + 0x18);
  uVar1 = *(ushort *)(*(long *)(in_RDI + 0x28) + 0x12);
  *(ushort *)(*(long *)(in_RDI + 0x28) + 0x12) = uVar1 + 1;
  *(undefined1 *)(lVar2 + (int)(uint)uVar1) = 0xc0;
  uVar3 = (uint)in_RSI->prscxstab->toktfset;
  emtres((emtcxdef *)in_stack_ffffffffffffffe0,objn);
  oswp2((void *)(*(long *)(*(long *)(in_RDI + 0x28) + 0x18) +
                (long)(int)(uint)*(ushort *)(*(long *)(in_RDI + 0x28) + 0x12)),uVar3);
  *(short *)(*(long *)(in_RDI + 0x28) + 0x12) = *(short *)(*(long *)(in_RDI + 0x28) + 0x12) + 2;
  return;
}

Assistant:

void prsgini(prscxdef *ctx, prsndef *node, uint curfr)
{
    int lcl;
    
    /* descend tree - always generate in order specified by user */
    if (node->prsnv.prsnvn[2])
        prsgini(ctx, node->prsnv.prsnvn[2], curfr);
    
    /* generate OPCLINE if one was specified */
    if (node->prsnnlf == 4)
    {
        uchar *p;
        uint   oldofs;
        
        /* tell the line source about the OPCLINE instruction */
        dbgclin(ctx->prscxtok, ctx->prscxemt->emtcxobj,
                (uint)ctx->prscxemt->emtcxofs);
        
        /* now actually emit the OPCLINE instruction */
        oldofs = ctx->prscxemt->emtcxofs;
        p = ctx->prscxpool + node->prsnv.prsnvn[3]->prsnv.prsnvt.tokofs;
        emtmem(ctx->prscxemt, p, (uint)(*(p + 1) + 1));
        
        /* fix it up with the correct frame */
        emtint2at(ctx->prscxemt, curfr, oldofs + 2);
    }
    
    prsgexp(ctx, node->prsnv.prsnvn[0]);
    emtop(ctx->prscxemt, OPCSETLCL);
    lcl = node->prsnv.prsnvn[1]->prsnv.prsnvt.tokval;
    emtint2(ctx->prscxemt, lcl);
}